

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraSim.c
# Opt level: O3

void Fra_SmlAssignConst(Fra_Sml_t *p,Aig_Obj_t *pObj,int fConst1,int iFrame)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  long lVar5;
  
  uVar4 = (uint)*(undefined8 *)&pObj->field_0x18 & 7;
  if (uVar4 != 2) {
    if (((ulong)pObj & 1) != 0) {
      __assert_fail("!Aig_IsComplement(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aig.h"
                    ,0x112,"int Aig_ObjIsConst1(Aig_Obj_t *)");
    }
    if (uVar4 != 1) {
      __assert_fail("Aig_ObjIsCi(pObj) || Aig_ObjIsConst1(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/fra/fraSim.c"
                    ,0x17f,"void Fra_SmlAssignConst(Fra_Sml_t *, Aig_Obj_t *, int, int)");
    }
  }
  iVar1 = p->nWordsFrame;
  if (0 < iVar1) {
    iVar2 = p->nWordsTotal;
    iVar3 = pObj->Id;
    lVar5 = 0;
    do {
      *(uint *)((long)&p[1].pAig +
               lVar5 * 4 + (long)(iVar1 * iFrame) * 4 + (long)(iVar2 * iVar3) * 4) =
           -(uint)(fConst1 != 0);
      lVar5 = lVar5 + 1;
    } while (lVar5 < p->nWordsFrame);
  }
  return;
}

Assistant:

void Fra_SmlAssignConst( Fra_Sml_t * p, Aig_Obj_t * pObj, int fConst1, int iFrame )
{
    unsigned * pSims;
    int i;
    assert( Aig_ObjIsCi(pObj) || Aig_ObjIsConst1(pObj) );
    pSims = Fra_ObjSim( p, pObj->Id ) + p->nWordsFrame * iFrame;
    for ( i = 0; i < p->nWordsFrame; i++ )
        pSims[i] = fConst1? ~(unsigned)0 : 0;
}